

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall capnp::compiler::NodeTranslator::compileEnum(NodeTranslator *this)

{
  ushort uVar1;
  undefined4 uVar2;
  Reader ordinal;
  Reader annotations;
  PointerType PVar3;
  int iVar4;
  WirePointer *pWVar5;
  _Base_ptr *pp_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  SegmentBuilder *pSVar10;
  uint uVar11;
  ElementCount index;
  SegmentBuilder *pSVar12;
  ElementCount EVar13;
  SegmentReader *pSVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Reader RVar19;
  StringPtr targetsFlagName;
  ElementCount in_stack_00000020;
  SegmentBuilder *in_stack_00000038;
  undefined8 in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  Builder enumerantBuilder;
  Builder list;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  enumerants;
  DuplicateOrdinalDetector dupDetector;
  Builder sourceInfoList;
  StructReader local_208;
  _Base_ptr local_1d0;
  PointerReader local_1c8;
  NodeTranslator *local_1a0;
  StructBuilder local_198;
  StructReader local_168;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  local_138;
  undefined1 local_108 [24];
  anon_union_48_1_a8c68091_for_NullableValue<capnp::compiler::LocatedInteger::Reader>_2 aStack_f0;
  StructReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  EVar13 = in_stack_00000020;
  local_138._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138._M_impl.super__Rb_tree_header._M_header;
  local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0 = this;
  local_138._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138._M_impl.super__Rb_tree_header._M_header._M_left;
  if (in_stack_00000020 != 0) {
    uVar11 = 0;
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_168,(ListReader *)&stack0x00000008,index);
      if ((0x1f < local_168.dataSize) && (*(short *)((long)local_168.data + 2) == 4)) {
        pWVar5 = local_168.pointers + 1;
        local_208.segment._0_4_ = local_168.segment._0_4_;
        local_208.segment._4_4_ = local_168.segment._4_4_;
        local_208.capTable._0_4_ = local_168.capTable._0_4_;
        local_208.capTable._4_4_ = local_168.capTable._4_4_;
        local_208.pointers._0_4_ = local_168.nestingLimit;
        if (local_168.pointerCount < 2) {
          pWVar5 = (WirePointer *)0x0;
          local_208.segment._0_4_ = 0;
          local_208.segment._4_4_ = 0;
          local_208.capTable._0_4_ = 0;
          local_208.capTable._4_4_ = 0;
          local_208.pointers._0_4_ = 0x7fffffff;
        }
        local_208.data._0_4_ = SUB84(pWVar5,0);
        local_208.data._4_4_ = (StructDataBitCount)((ulong)pWVar5 >> 0x20);
        capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)&local_208,(word *)0x0);
        if (local_c0.dataSize < 0x40) {
          local_108._0_8_ = (SegmentBuilder *)0x0;
        }
        else {
          local_108._0_8_ = *local_c0.data;
        }
        local_208.pointerCount = (StructPointerCount)local_168.dataSize;
        local_208._38_2_ = SUB42(local_168.dataSize >> 0x10,0);
        local_208.nestingLimit =
             (int)(CONCAT26(local_168._38_2_,CONCAT24(local_168.pointerCount,local_168.dataSize)) >>
                  0x20);
        local_208.data._4_4_ = (StructDataBitCount)local_168.data;
        local_208.pointers._0_4_ = (int)((ulong)local_168.data >> 0x20);
        local_208.pointers._4_4_ = SUB84(local_168.pointers,0);
        local_208.dataSize = (StructDataBitCount)((ulong)local_168.pointers >> 0x20);
        aStack_f0._36_4_ = local_168._44_4_;
        aStack_f0._16_4_ = local_208.pointers._4_4_;
        aStack_f0._12_4_ = (int)local_208.pointers;
        aStack_f0._24_2_ = local_208.pointerCount;
        aStack_f0._20_4_ = local_208.dataSize;
        aStack_f0._26_2_ = local_208._38_2_;
        aStack_f0._32_4_ = local_168.nestingLimit;
        aStack_f0._28_4_ = local_208.nestingLimit;
        aStack_f0._4_4_ = local_168.capTable._4_4_;
        aStack_f0._8_4_ = local_208.data._4_4_;
        local_108._12_4_ = local_208.segment._0_4_;
        aStack_f0._0_4_ = local_168.capTable._0_4_;
        local_108._8_4_ = uVar11;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
        ::
        _M_emplace_equal<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                    *)&local_138,
                   (pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
                    *)local_108);
        uVar11 = uVar11 + 1;
      }
      index = index + 1;
    } while (EVar13 != index);
  }
  pSVar12 = in_stack_00000038;
  *(undefined2 *)(in_stack_00000048 + 0xc) = 2;
  pSVar14 = (SegmentReader *)(in_stack_00000050 + 0x18);
  local_108._0_8_ = in_stack_00000038;
  local_108._8_4_ = (undefined4)in_stack_00000040;
  uVar2 = local_108._8_4_;
  local_108._12_4_ = (undefined4)((ulong)in_stack_00000040 >> 0x20);
  uVar15 = local_108._12_4_;
  local_108._16_8_ = pSVar14;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_108);
  local_108._0_8_ = pSVar12;
  local_108._8_4_ = uVar2;
  local_108._12_4_ = uVar15;
  local_108._16_8_ = pSVar14;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)&local_168,(PointerBuilder *)local_108,
             (ElementCount)local_138._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x20001
            );
  capnp::_::OrphanBuilder::asStruct
            ((StructBuilder *)local_108,&(local_1a0->sourceInfo).builder,(StructSize)0x20001);
  local_208.data = (void *)(CONCAT44(aStack_f0._4_4_,aStack_f0._0_4_) + 8);
  local_208.segment._0_4_ = (undefined4)local_108._0_8_;
  local_208.segment._4_4_ = SUB84(local_108._0_8_,4);
  local_208.capTable._0_4_ = local_108._8_4_;
  local_208.capTable._4_4_ = local_108._12_4_;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)&local_c0,(PointerBuilder *)&local_208,
             (ElementCount)local_138._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x10000
            );
  local_108._0_8_ = local_1a0->errorReporter;
  local_108._8_4_ = 0;
  local_108._16_4_ = local_108._16_4_ & 0xffffff00;
  if ((_Rb_tree_header *)local_138._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_138._M_impl.super__Rb_tree_header) {
    EVar13 = 0;
    p_Var7 = local_138._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar12 = (SegmentBuilder *)p_Var7[1]._M_left;
      local_1d0 = p_Var7[1]._M_right;
      p_Var9 = p_Var7[2]._M_parent;
      uVar1 = *(ushort *)((long)&p_Var7[2]._M_left + 4);
      iVar4 = *(int *)&p_Var7[2]._M_right;
      if (uVar1 < 2) {
        p_Var8 = (_Base_ptr)0x0;
        pp_Var6 = (_Base_ptr *)0x0;
        pSVar10 = (SegmentBuilder *)0x0;
        local_208.pointers._0_4_ = 0x7fffffff;
      }
      else {
        pp_Var6 = &p_Var9->_M_parent;
        p_Var8 = local_1d0;
        pSVar10 = pSVar12;
        local_208.pointers._0_4_ = iVar4;
      }
      uVar2 = *(undefined4 *)&p_Var7[1]._M_parent;
      local_208.segment._0_4_ = SUB84(pSVar10,0);
      local_208.segment._4_4_ = (undefined4)((ulong)pSVar10 >> 0x20);
      local_208.capTable._0_4_ = (uint)p_Var8;
      local_208.capTable._4_4_ = (undefined4)((ulong)p_Var8 >> 0x20);
      local_208.data._0_4_ = SUB84(pp_Var6,0);
      local_208.data._4_4_ = (StructDataBitCount)((ulong)pp_Var6 >> 0x20);
      capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_208,(word *)0x0);
      ordinal._reader.capTable = local_60.capTable;
      ordinal._reader.segment = local_60.segment;
      ordinal._reader.data = local_60.data;
      ordinal._reader.pointers = local_60.pointers;
      ordinal._reader.dataSize = local_60.dataSize;
      ordinal._reader.pointerCount = local_60.pointerCount;
      ordinal._reader._38_2_ = local_60._38_2_;
      ordinal._reader.nestingLimit = local_60.nestingLimit;
      ordinal._reader._44_4_ = local_60._44_4_;
      DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)local_108,ordinal);
      if (uVar1 < 5) {
        local_208.segment._0_4_ = 0;
        local_208.segment._4_4_ = 0;
        local_208.capTable._0_4_ = 0;
        local_208.capTable._4_4_ = 0;
        local_208.data = (_Base_ptr)0x0;
        local_208.pointers._0_4_ = 0x7fffffff;
      }
      else {
        local_208.data = p_Var9 + 1;
        local_208.segment._0_4_ = SUB84(pSVar12,0);
        local_208.segment._4_4_ = (undefined4)((ulong)pSVar12 >> 0x20);
        local_208.capTable._0_4_ = (uint)local_1d0;
        local_208.capTable._4_4_ = (undefined4)((ulong)local_1d0 >> 0x20);
        local_208.pointers._0_4_ = iVar4;
      }
      PVar3 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_208);
      if (PVar3 != NULL_) {
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&local_208,(ListBuilder *)&local_c0,EVar13);
        if (uVar1 < 5) {
          local_198.pointers._0_4_ = 0x7fffffff;
          local_198.capTable = (CapTableBuilder *)0x0;
          local_198.data = (_Base_ptr)0x0;
          local_198.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_198.data = p_Var9 + 1;
          local_198.capTable = (CapTableBuilder *)local_1d0;
          local_198.segment = pSVar12;
          local_198.pointers._0_4_ = iVar4;
        }
        RVar19 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_198,(void *)0x0,0);
        local_198.data = (void *)CONCAT44(local_208.pointers._4_4_,(int)local_208.pointers);
        local_198.segment =
             (SegmentBuilder *)CONCAT44(local_208.segment._4_4_,local_208.segment._0_4_);
        local_198.capTable =
             (CapTableBuilder *)CONCAT44(local_208.capTable._4_4_,(uint)local_208.capTable);
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_198,RVar19);
      }
      capnp::_::ListBuilder::getStructElement(&local_198,(ListBuilder *)&local_168,EVar13);
      local_1c8.capTable = (CapTableReader *)local_1d0;
      local_1c8.pointer = (WirePointer *)p_Var9;
      local_1c8.segment = (SegmentReader *)pSVar12;
      local_1c8.nestingLimit = iVar4;
      if (uVar1 == 0) {
        local_1c8.capTable = (CapTableReader *)(_Base_ptr)0x0;
        local_1c8.pointer = (WirePointer *)(_Base_ptr)0x0;
        local_1c8.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
        local_1c8.nestingLimit = 0x7fffffff;
      }
      capnp::_::PointerReader::getStruct(&local_208,&local_1c8,(word *)0x0);
      local_1c8.pointer = (WirePointer *)CONCAT44(local_208.pointers._4_4_,(int)local_208.pointers);
      local_1c8.nestingLimit = local_208.nestingLimit;
      if (local_208.pointerCount == 0) {
        local_1c8.pointer = (WirePointer *)0x0;
        local_1c8.nestingLimit = 0x7fffffff;
      }
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      if (local_208.pointerCount != 0) {
        uVar15 = local_208.segment._0_4_;
        uVar16 = local_208.segment._4_4_;
        uVar17 = (uint)local_208.capTable;
        uVar18 = local_208.capTable._4_4_;
      }
      local_1c8.segment = (SegmentReader *)CONCAT44(uVar16,uVar15);
      local_1c8.capTable = (CapTableReader *)CONCAT44(uVar18,uVar17);
      RVar19 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
      local_1c8.pointer = (WirePointer *)CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers);
      local_1c8.segment = &(local_198.segment)->super_SegmentReader;
      local_1c8.capTable = &(local_198.capTable)->super_CapTableReader;
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1c8,RVar19);
      *(short *)local_198.data = (short)uVar2;
      if (uVar1 < 4) {
        iVar4 = 0x7fffffff;
        p_Var9 = (_Base_ptr)0x0;
        pp_Var6 = (_Base_ptr *)0x0;
        pSVar12 = (SegmentBuilder *)0x0;
      }
      else {
        pp_Var6 = &p_Var9->_M_right;
        p_Var9 = local_1d0;
      }
      local_208.segment._0_4_ = SUB84(pSVar12,0);
      local_208.segment._4_4_ = (undefined4)((ulong)pSVar12 >> 0x20);
      local_208.capTable._0_4_ = (uint)p_Var9;
      local_208.capTable._4_4_ = (undefined4)((ulong)p_Var9 >> 0x20);
      local_208.data._0_4_ = SUB84(pp_Var6,0);
      local_208.data._4_4_ = (StructDataBitCount)((ulong)pp_Var6 >> 0x20);
      local_208.pointers._0_4_ = iVar4;
      capnp::_::PointerReader::getList
                (&local_90,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
      annotations.reader.capTable = local_90.capTable;
      annotations.reader.segment = local_90.segment;
      annotations.reader.ptr = local_90.ptr;
      annotations.reader.elementCount = local_90.elementCount;
      annotations.reader.step = local_90.step;
      annotations.reader.structDataSize = local_90.structDataSize;
      annotations.reader.structPointerCount = local_90.structPointerCount;
      annotations.reader.elementSize = local_90.elementSize;
      annotations.reader._39_1_ = local_90._39_1_;
      annotations.reader.nestingLimit = local_90.nestingLimit;
      annotations.reader._44_4_ = local_90._44_4_;
      targetsFlagName.content.size_ = 0x11;
      targetsFlagName.content.ptr = "targetsEnumerant";
      compileAnnotationApplications
                ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&local_1c8,
                 local_1a0,annotations,targetsFlagName);
      local_208.data = (void *)(CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers) + 8);
      local_208.segment._0_4_ = SUB84(local_198.segment,0);
      local_208.segment._4_4_ = (undefined4)((ulong)local_198.segment >> 0x20);
      local_208.capTable._0_4_ = (uint)local_198.capTable;
      local_208.capTable._4_4_ = (undefined4)((ulong)local_198.capTable >> 0x20);
      capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_208,(OrphanBuilder *)&local_1c8);
      if (local_1c8.capTable != (CapTableReader *)0x0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_1c8);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      EVar13 = EVar13 + 1;
    } while ((_Rb_tree_header *)p_Var7 != &local_138._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~_Rb_tree(&local_138);
  return;
}

Assistant:

void NodeTranslator::compileEnum(Void decl,
                                 List<Declaration>::Reader members,
                                 schema::Node::Builder builder) {
  // maps ordinal -> (code order, declaration)
  std::multimap<uint, std::pair<uint, Declaration::Reader>> enumerants;

  uint codeOrder = 0;
  for (auto member: members) {
    if (member.isEnumerant()) {
      enumerants.insert(
          std::make_pair(member.getId().getOrdinal().getValue(),
                         std::make_pair(codeOrder++, member)));
    }
  }

  auto list = builder.initEnum().initEnumerants(enumerants.size());
  auto sourceInfoList = sourceInfo.get().initMembers(enumerants.size());
  uint i = 0;
  DuplicateOrdinalDetector dupDetector(errorReporter);

  for (auto& entry: enumerants) {
    uint codeOrder = entry.second.first;
    Declaration::Reader enumerantDecl = entry.second.second;

    dupDetector.check(enumerantDecl.getId().getOrdinal());

    if (enumerantDecl.hasDocComment()) {
      sourceInfoList[i].setDocComment(enumerantDecl.getDocComment());
    }

    auto enumerantBuilder = list[i++];
    enumerantBuilder.setName(enumerantDecl.getName().getValue());
    enumerantBuilder.setCodeOrder(codeOrder);
    enumerantBuilder.adoptAnnotations(compileAnnotationApplications(
        enumerantDecl.getAnnotations(), "targetsEnumerant"));
  }
}